

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall
Json::BuiltStyledStreamWriter::isMultineArray(BuiltStyledStreamWriter *this,Value *value)

{
  CommentInfo *pCVar1;
  byte bVar2;
  bool bVar3;
  ArrayIndex AVar4;
  ArrayIndex AVar5;
  Value *pVVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  
  AVar4 = Value::size(value);
  bVar11 = this->rightMargin_ <= AVar4 * 3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->childValues_);
  if (AVar4 != 0 && !bVar11) {
    uVar8 = 1;
    do {
      pVVar6 = Value::operator[](value,uVar8 - 1);
      if ((*(ushort *)&pVVar6->field_0x8 & 0xfe) == 6) {
        AVar5 = Value::size(pVVar6);
        bVar11 = AVar5 != 0;
      }
      else {
        bVar11 = false;
      }
    } while ((uVar8 < AVar4) && (uVar8 = uVar8 + 1, !bVar11));
  }
  bVar3 = true;
  if (!bVar11) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&this->childValues_,(ulong)AVar4);
    bVar2 = this->field_0xd8 | 1;
    this->field_0xd8 = bVar2;
    uVar8 = AVar4 * 2 + 2;
    if (AVar4 == 0) {
      bVar7 = 0;
    }
    else {
      lVar9 = 8;
      uVar10 = 0;
      bVar7 = 0;
      do {
        pVVar6 = Value::operator[](value,(ArrayIndex)uVar10);
        pCVar1 = pVVar6->comments_;
        if ((pCVar1 != (CommentInfo *)0x0) &&
           (((pCVar1->comment_ != (char *)0x0 || (pCVar1[1].comment_ != (char *)0x0)) ||
            (pCVar1[2].comment_ != (char *)0x0)))) {
          bVar7 = 1;
        }
        pVVar6 = Value::operator[](value,(ArrayIndex)uVar10);
        writeValue(this,pVVar6);
        uVar8 = uVar8 + *(int *)((long)&(((this->childValues_).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar9);
        uVar10 = uVar10 + 1;
        lVar9 = lVar9 + 0x20;
      } while (AVar4 != uVar10);
      bVar2 = this->field_0xd8;
    }
    this->field_0xd8 = bVar2 & 0xfe;
    bVar3 = (bool)(this->rightMargin_ <= uVar8 | bVar7);
  }
  return bVar3;
}

Assistant:

bool BuiltStyledStreamWriter::isMultineArray(Value const& value) {
  ArrayIndex const size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (ArrayIndex index = 0; index < size && !isMultiLine; ++index) {
    Value const& childValue = value[index];
    isMultiLine = ((childValue.isArray() || childValue.isObject()) &&
                        childValue.size() > 0);
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    ArrayIndex lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (ArrayIndex index = 0; index < size; ++index) {
      if (hasCommentForValue(value[index])) {
        isMultiLine = true;
      }
      writeValue(value[index]);
      lineLength += static_cast<ArrayIndex>(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}